

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O0

size_t __thiscall adios2::transport::FileRemote::GetSize(FileRemote *this)

{
  Mode MVar1;
  FileRemote *in_RDI;
  
  WaitForOpen(in_RDI);
  MVar1 = (in_RDI->super_Transport).m_OpenMode;
  if (MVar1 != Write) {
    if (MVar1 == Read) {
      return in_RDI->m_Size;
    }
    if (MVar1 != Append) {
      return 0;
    }
  }
  return 0;
}

Assistant:

size_t FileRemote::GetSize()
{
    WaitForOpen();
    switch (m_OpenMode)
    {
    case Mode::Write:
    case Mode::Append:
        return 0;
    case Mode::Read:
        return m_Size;
    default:
        return 0;
    }
}